

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_agent.cpp
# Opt level: O2

Error * ot::commissioner::UnixTime::FromString
                  (Error *__return_storage_ptr__,UnixTime *aTime,string *aTimeStr)

{
  char *pcVar1;
  char *begin;
  time_t tVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string sStack_a8;
  format_string_checker<char> local_88;
  tm lTm;
  
  pcVar1 = strptime((aTimeStr->_M_dataplus)._M_p,kFmtString_abi_cxx11_,(tm *)&lTm);
  if ((pcVar1 == (char *)0x0) || (*pcVar1 != '\0')) {
    local_88.types_[0] = string_type;
    local_88.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "ill formed time string {}";
    local_88.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x19;
    local_88.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_88.context_.super_basic_format_parse_context<char>._20_4_ = 1;
    local_88.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
    pcVar1 = "ill formed time string {}";
    local_88.context_.types_ = local_88.types_;
    while (begin = pcVar1, begin != "") {
      pcVar1 = begin + 1;
      if (*begin == '}') {
        if ((pcVar1 == "") || (*pcVar1 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar1 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar1 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (begin,"",&local_88);
      }
    }
    local_88._0_8_ = (aTimeStr->_M_dataplus)._M_p;
    local_88.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         (char *)aTimeStr->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x19;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_88;
    ::fmt::v10::vformat_abi_cxx11_(&sStack_a8,(v10 *)"ill formed time string {}",fmt,args);
    __return_storage_ptr__->mCode = kBadFormat;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->mMessage,(string *)&sStack_a8);
    std::__cxx11::string::~string((string *)&sStack_a8);
  }
  else {
    tVar2 = mktime((tm *)&lTm);
    aTime->mTime = tVar2;
    __return_storage_ptr__->mCode = kNone;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_string_length = 0;
    (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Error UnixTime::FromString(UnixTime &aTime, const std::string &aTimeStr)
{
    std::tm lTm;
    char   *result = strptime(aTimeStr.c_str(), kFmtString.c_str(), &lTm);
    if (result != nullptr && *result == '\000')
    {
        aTime = std::mktime(&lTm);
        return ERROR_NONE;
    }
    return ERROR_BAD_FORMAT("ill formed time string {}", aTimeStr);
}